

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O0

vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> * __thiscall
rr::VertexPacketAllocator::allocArray
          (vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *__return_storage_ptr__,
          VertexPacketAllocator *this,size_t count)

{
  VertexPacket *this_00;
  size_t local_88;
  bad_alloc *anon_var_0;
  ulong local_58;
  size_t i;
  value_type local_40;
  deInt8 *ptr;
  long local_30;
  size_t packetSize;
  size_t extraVaryings;
  size_t count_local;
  VertexPacketAllocator *this_local;
  vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *retVal;
  
  extraVaryings = count;
  count_local = (size_t)this;
  this_local = (VertexPacketAllocator *)__return_storage_ptr__;
  if (count == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::vector
              (__return_storage_ptr__);
  }
  else {
    if (this->m_numberOfVertexOutputs == 0) {
      local_88 = 0;
    }
    else {
      local_88 = this->m_numberOfVertexOutputs - 1;
    }
    packetSize = local_88;
    local_30 = local_88 * 0x10 + 0x30;
    ptr._7_1_ = 0;
    std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::vector
              (__return_storage_ptr__);
    local_40 = (value_type)operator_new__(local_30 * extraVaryings);
    for (local_58 = 0; local_58 < extraVaryings; local_58 = local_58 + 1) {
      this_00 = (VertexPacket *)(local_40 + local_58 * local_30);
      VertexPacket::VertexPacket(this_00);
      anon_var_0 = (bad_alloc *)this_00;
      std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::push_back
                (__return_storage_ptr__,(value_type *)&anon_var_0);
    }
    std::vector<signed_char_*,_std::allocator<signed_char_*>_>::push_back
              (&this->m_allocations,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VertexPacket*> VertexPacketAllocator::allocArray (size_t count)
{
	if (!count)
		return std::vector<VertexPacket*>();

	const size_t extraVaryings	= (m_numberOfVertexOutputs == 0) ? (0) : (m_numberOfVertexOutputs-1);
	const size_t packetSize		= sizeof(VertexPacket) + extraVaryings * sizeof(GenericVec4);

	std::vector<VertexPacket*>	retVal;
	deInt8*						ptr = new deInt8[packetSize * count]; // throws bad_alloc => ok

	// *.push_back might throw bad_alloc
	try
	{
		// run ctors
		for (size_t i = 0; i < count; ++i)
			retVal.push_back(new (ptr + i*packetSize) VertexPacket()); // throws bad_alloc

		m_allocations.push_back(ptr); // throws bad_alloc
	}
	catch (std::bad_alloc& )
	{
		delete [] ptr;
		throw;
	}

	return retVal;
}